

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O0

void __thiscall ExprWriter::visit(ExprWriter *this,AggregateInitializer *expr)

{
  bool bVar1;
  long in_RSI;
  vector<Expr_*,_std::allocator<Expr_*>_> *in_RDI;
  Expr **val;
  iterator __end1;
  iterator __begin1;
  vector<Expr_*,_std::allocator<Expr_*>_> *__range1;
  __normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> local_20;
  long local_18;
  long local_10;
  
  local_10 = in_RSI;
  std::operator<<((ostream *)
                  (in_RDI->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish,"{");
  local_18 = local_10 + 0x18;
  local_20._M_current = (Expr **)std::vector<Expr_*,_std::allocator<Expr_*>_>::begin(in_RDI);
  std::vector<Expr_*,_std::allocator<Expr_*>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> *)
                       in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> *)
         __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::
         operator*(&local_20);
    (*((Expr *)in_stack_ffffffffffffffd0->_M_current)->_vptr_Expr[2])
              ((Expr *)in_stack_ffffffffffffffd0->_M_current,in_RDI);
    std::operator<<((ostream *)
                    (in_RDI->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish,",");
    __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::operator++
              (&local_20);
  }
  std::operator<<((ostream *)
                  (in_RDI->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish,"}");
  return;
}

Assistant:

void ExprWriter::visit(AggregateInitializer& expr) {
    ss << "{";
    for (auto& val : expr.values) {
        val->accept(*this);
        ss << ",";
    }
    ss << "}";
}